

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_widget_has_mouse_click_down(nk_context *ctx,nk_buttons btn,int down)

{
  int iVar1;
  bool local_35;
  undefined1 local_34 [8];
  nk_rect bounds;
  int ret;
  int down_local;
  nk_buttons btn_local;
  nk_context *ctx_local;
  
  bounds.h = (float)down;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x48c3,
                  "int nk_widget_has_mouse_click_down(struct nk_context *, enum nk_buttons, int)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if ((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) {
      ctx_local._4_4_ = 0;
    }
    else {
      nk_layout_peek((nk_rect *)local_34,ctx);
      bounds.w = (float)(uint)(ctx->active == ctx->current);
      local_35 = false;
      if (bounds.w != 0.0) {
        iVar1 = nk_input_has_mouse_click_down_in_rect(&ctx->input,btn,_local_34,(int)bounds.h);
        local_35 = iVar1 != 0;
      }
      ctx_local._4_4_ = (uint)local_35;
    }
    return ctx_local._4_4_;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x48c4,
                "int nk_widget_has_mouse_click_down(struct nk_context *, enum nk_buttons, int)");
}

Assistant:

NK_API int
nk_widget_has_mouse_click_down(struct nk_context *ctx, enum nk_buttons btn, int down)
{
    int ret;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return 0;

    nk_layout_peek(&bounds, ctx);
    ret = (ctx->active == ctx->current);
    ret = ret && nk_input_has_mouse_click_down_in_rect(&ctx->input, btn, bounds, down);
    return ret;
}